

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.hpp
# Opt level: O0

descriptor<pstore::details::posix_descriptor_traits> * __thiscall
pstore::details::descriptor<pstore::details::posix_descriptor_traits>::operator=
          (descriptor<pstore::details::posix_descriptor_traits> *this,
          descriptor<pstore::details::posix_descriptor_traits> *rhs)

{
  value_type vVar1;
  descriptor<pstore::details::posix_descriptor_traits> *rhs_local;
  descriptor<pstore::details::posix_descriptor_traits> *this_local;
  
  if (this != rhs) {
    reset(this,-1);
    vVar1 = release(rhs);
    this->fd_ = vVar1;
  }
  return this;
}

Assistant:

descriptor & operator= (descriptor && rhs) noexcept {
                if (this != &rhs) {
                    reset ();
                    fd_ = rhs.release ();
                    traits_ = std::move (rhs.traits_);
                }
                return *this;
            }